

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermSelection * __thiscall
glslang::TIntermediate::addSelection
          (TIntermediate *this,TIntermTyped *cond,TIntermNodePair nodePair,TSourceLoc *loc)

{
  TPoolAllocator *this_00;
  TIntermSelection *this_01;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermSelection *)TPoolAllocator::allocate(this_00,0xd8);
  TIntermTyped::TIntermTyped((TIntermTyped *)this_01,EbtVoid);
  (this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00afcd58;
  this_01->condition = cond;
  this_01->trueBlock = nodePair.node1;
  this_01->falseBlock = nodePair.node2;
  this_01->shortCircuit = true;
  this_01->flatten = false;
  this_01->dontFlatten = false;
  TIntermNode::setLoc((TIntermNode *)this_01,loc);
  return this_01;
}

Assistant:

TIntermSelection* TIntermediate::addSelection(TIntermTyped* cond, TIntermNodePair nodePair, const TSourceLoc& loc)
{
    //
    // Don't prune the false path for compile-time constants; it's needed
    // for static access analysis.
    //

    TIntermSelection* node = new TIntermSelection(cond, nodePair.node1, nodePair.node2);
    node->setLoc(loc);

    return node;
}